

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeViewPrivate::updateAccessibility(QTreeViewPrivate *this)

{
  undefined8 uVar1;
  char cVar2;
  long in_FS_OFFSET;
  QAccessibleTableModelChangeEvent event;
  code *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->pendingAccessibilityUpdate == true) {
    uVar1 = *(undefined8 *)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    this->pendingAccessibilityUpdate = false;
    cVar2 = QAccessible::isActive();
    if (cVar2 != '\0') {
      uStack_30 = 0xffffffff;
      local_48 = QIcon::QIcon;
      local_28 = 0xffffffff;
      uStack_24 = 0xffffffff;
      uStack_20 = 0xffffffff;
      uStack_1c = 0xffffffff;
      uStack_40 = 0xaaaaaaaa00000116;
      local_38 = uVar1;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
      QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                ((QAccessibleTableModelChangeEvent *)&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::updateAccessibility()
{
#if QT_CONFIG(accessibility)
    Q_Q(QTreeView);
    if (pendingAccessibilityUpdate) {
        pendingAccessibilityUpdate = false;
        if (QAccessible::isActive()) {
            QAccessibleTableModelChangeEvent event(q, QAccessibleTableModelChangeEvent::ModelReset);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
}